

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_av.c
# Opt level: O1

dtl_error_t dtl_av_sort(dtl_av_t *self,dtl_key_func_t *key,_Bool reverse)

{
  void **ppvVar1;
  dtl_sv_t *pdVar2;
  dtl_sv_t *other;
  bool bVar3;
  dtl_av_t *pdVar4;
  dtl_dv_type_id dVar5;
  dtl_dv_type_id dVar6;
  dtl_error_t dVar7;
  undefined7 in_register_00000011;
  ulong uVar8;
  int iVar9;
  int iVar10;
  dtl_error_t unaff_R15D;
  _Bool local_41;
  undefined4 local_40;
  int local_3c;
  dtl_av_t *local_38;
  
  if (self == (dtl_av_t *)0x0) {
    dVar7 = 1;
  }
  else {
    dVar7 = 3;
    if (key == (dtl_key_func_t *)0x0) {
      local_3c = self->pAny->s32CurLen;
      if (1 < local_3c) {
        local_40 = (undefined4)CONCAT71(in_register_00000011,reverse);
        iVar10 = 1;
        local_38 = self;
        do {
          iVar9 = iVar10;
          if (local_3c <= iVar9) break;
          local_41 = false;
          ppvVar1 = local_38->pAny->pFirst;
          pdVar2 = (dtl_sv_t *)ppvVar1[(long)iVar9 + -1];
          if ((pdVar2 == (dtl_sv_t *)0x0) ||
             (other = (dtl_sv_t *)ppvVar1[iVar9], other == (dtl_sv_t *)0x0)) {
            __assert_fail("(left != 0) && (right != 0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_type/src/dtl_av.c"
                          ,0xe6,"dtl_error_t dtl_av_insertion_sort(dtl_av_t *, _Bool)");
          }
          dVar5 = dtl_dv_type((dtl_dv_t *)pdVar2);
          dVar6 = dtl_dv_type((dtl_dv_t *)other);
          bVar3 = false;
          dVar7 = 4;
          iVar10 = iVar9;
          if (dVar5 == DTL_DV_SCALAR) {
            if (dVar6 == DTL_DV_SCALAR) {
              dVar7 = dtl_sv_lt(pdVar2,other,&local_41);
              pdVar4 = local_38;
              if (dVar7 != 0) goto LAB_0013d750;
              if ((char)local_40 != '\0') {
                local_41 = (_Bool)(local_41 ^ 1);
              }
              if (local_41 == false) {
                uVar8 = (ulong)(iVar9 - 1U);
                local_38->pAny->pFirst[iVar9] = pdVar2;
                if (1 < iVar9) {
                  uVar8 = (ulong)(iVar9 - 1U);
                  do {
                    pdVar2 = (dtl_sv_t *)pdVar4->pAny->pFirst[uVar8 - 1];
                    dVar5 = dtl_dv_type((dtl_dv_t *)pdVar2);
                    if (dVar5 != DTL_DV_SCALAR) {
                      dVar7 = 4;
LAB_0013d80c:
                      unaff_R15D = dVar7;
                      bVar3 = false;
                      goto LAB_0013d80e;
                    }
                    dVar7 = dtl_sv_lt(pdVar2,other,&local_41);
                    if (dVar7 != 0) goto LAB_0013d80c;
                    if ((char)local_40 != '\0') {
                      local_41 = (_Bool)(local_41 ^ 1);
                    }
                    if (local_41 != false) goto LAB_0013d7f2;
                    pdVar4->pAny->pFirst[uVar8] = pdVar2;
                    bVar3 = 1 < (long)uVar8;
                    uVar8 = uVar8 - 1;
                  } while (bVar3);
                  uVar8 = 0;
                }
LAB_0013d7f2:
                pdVar4->pAny->pFirst[(int)uVar8] = other;
                bVar3 = true;
LAB_0013d80e:
                dVar7 = unaff_R15D;
                if (!bVar3) goto LAB_0013d750;
              }
              iVar10 = iVar9 + 1;
              bVar3 = true;
              dVar7 = unaff_R15D;
            }
          }
          else {
LAB_0013d750:
            bVar3 = false;
          }
          unaff_R15D = dVar7;
        } while (bVar3);
        if (iVar9 < local_3c) {
          return unaff_R15D;
        }
      }
      dVar7 = 0;
    }
  }
  return dVar7;
}

Assistant:

dtl_error_t dtl_av_sort(dtl_av_t *self, dtl_key_func_t *key, bool reverse)
{
   if (self != 0)
   {
      if (key != 0)
      {
         return DTL_NOT_IMPLEMENTED_ERROR;
      }
      return dtl_av_insertion_sort(self, reverse);
   }
   return DTL_INVALID_ARGUMENT_ERROR;
}